

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-nice-strict.h
# Opt level: O1

void __thiscall
testing::StrictMock<solitaire::archivers::SnapshotMock>::StrictMock
          (StrictMock<solitaire::archivers::SnapshotMock> *this)

{
  Mock::FailUninterestingCalls(this);
  memset(this,0,0x98);
  (this->super_SnapshotMock).super_Snapshot._vptr_Snapshot =
       (_func_int **)&PTR__SnapshotMock_00322638;
  internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->super_SnapshotMock).gmock10_restore_10.super_UntypedFunctionMockerBase);
  (this->super_SnapshotMock).gmock10_restore_10.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_0031e018;
  internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->super_SnapshotMock).gmock11_isSnapshotOfSameObject_12.
              super_UntypedFunctionMockerBase);
  (this->super_SnapshotMock).gmock11_isSnapshotOfSameObject_12.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_00322668;
  (this->super_SnapshotMock).super_Snapshot._vptr_Snapshot = (_func_int **)&PTR__StrictMock_00322598
  ;
  return;
}

Assistant:

StrictMock() : MockClass() {
    static_assert(sizeof(*this) == sizeof(MockClass),
                  "The impl subclass shouldn't introduce any padding");
  }